

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void remove_zero_pad(double *Y,int rows,int cols,int zrow,int zcol,double *Z)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = cols - zcol;
  uVar2 = 0;
  uVar4 = 0;
  if (0 < (int)uVar3) {
    uVar4 = (ulong)uVar3;
  }
  uVar1 = rows - zrow;
  if (rows - zrow < 1) {
    uVar1 = 0;
  }
  for (; uVar2 != uVar1; uVar2 = uVar2 + 1) {
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      Z[uVar5] = Y[uVar5];
    }
    Z = Z + (int)uVar3;
    Y = Y + cols;
  }
  return;
}

Assistant:

void remove_zero_pad(double *Y, int rows, int cols, int zrow, int zcol,double *Z) {
	int r,c,i,j,u,v;
	r = rows - zrow;
	c = cols - zcol;
	
	for (i = 0; i < r; ++i) {
		u = i * c;
		v = i * cols;
		for (j = 0; j < c; ++j) {
			Z[j + u] = Y[j + v];
		}
	}
}